

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pager_write(PgHdr *pPg)

{
  u8 uVar1;
  u32 uVar2;
  Pager *pPager;
  sqlite3_file *psVar3;
  u8 *aData;
  sqlite3_vfs *psVar4;
  int iVar5;
  int iVar6;
  u32 uVar7;
  uint uVar8;
  uint uVar9;
  ulong in_RAX;
  MemJournal *p;
  Bitvec *pBVar10;
  long lVar11;
  undefined8 local_38;
  
  pPager = pPg->pPager;
  local_38 = in_RAX;
  if (pPager->eState == '\x02') {
    if (pPager->errCode != 0) {
      return pPager->errCode;
    }
    if ((pPager->pWal == (Wal *)0x0) && (pPager->journalMode != '\x02')) {
      psVar4 = pPager->pVfs;
      pBVar10 = sqlite3BitvecCreate(pPager->dbSize);
      pPager->pInJournal = pBVar10;
      if (pBVar10 == (Bitvec *)0x0) {
        return 7;
      }
      psVar3 = pPager->jfd;
      if (psVar3->pMethods == (sqlite3_io_methods *)0x0) {
        if (pPager->journalMode == '\x04') {
          psVar3[5].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[3].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[4].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[1].pMethods = (sqlite3_io_methods *)0x0;
          psVar3[2].pMethods = (sqlite3_io_methods *)0x0;
          psVar3->pMethods = &MemJournalMethods;
        }
        else {
          uVar1 = pPager->tempFile;
          local_38 = local_38 & 0xffffffff00000000;
          if (((uVar1 == '\0') && (pPager->dbSize != 0)) &&
             (iVar5 = (*pPager->fd->pMethods->xFileControl)(pPager->fd,0x14,&local_38), iVar5 != 0xc
             )) {
            if (iVar5 == 0) {
              iVar6 = 0x408;
              if ((int)local_38 != 0) goto LAB_00122b06;
            }
            if (iVar5 == 0) goto LAB_00122aba;
          }
          else {
LAB_00122aba:
            iVar5 = 0x100e;
            if (uVar1 == '\0') {
              iVar5 = 0x806;
            }
            iVar5 = (*psVar4->xOpen)(psVar4,pPager->zJournal,pPager->jfd,iVar5,(int *)0x0);
          }
          iVar6 = iVar5;
          if (iVar5 != 0) goto LAB_00122b06;
        }
      }
      pPager->nRec = 0;
      pPager->setMaster = '\0';
      pPager->journalOff = 0;
      pPager->journalHdr = 0;
      iVar6 = writeJournalHdr(pPager);
      if (iVar6 != 0) {
LAB_00122b06:
        sqlite3BitvecDestroy(pPager->pInJournal);
        pPager->pInJournal = (Bitvec *)0x0;
        return iVar6;
      }
    }
    pPager->eState = '\x03';
  }
  sqlite3PcacheMakeDirty(pPg);
  uVar2 = pPg->pgno;
  iVar5 = sqlite3BitvecTest(pPager->pInJournal,uVar2);
  if (iVar5 == 0) {
    if (pPager->pWal == (Wal *)0x0) {
      if ((pPager->dbOrigSize < uVar2) ||
         (psVar3 = pPager->jfd, psVar3->pMethods == (sqlite3_io_methods *)0x0)) {
        if (pPager->eState != '\x04') {
          *(byte *)&pPg->flags = (byte)pPg->flags | 4;
        }
      }
      else {
        lVar11 = pPager->journalOff;
        aData = (u8 *)pPg->pData;
        uVar7 = pager_cksum(pPager,aData);
        local_38 = CONCAT44(uVar7,(int)local_38);
        *(byte *)&pPg->flags = (byte)pPg->flags | 4;
        iVar5 = write32bits(psVar3,lVar11,uVar2);
        if (iVar5 != 0) {
          return iVar5;
        }
        uVar2 = local_38._4_4_;
        lVar11 = lVar11 + 4;
        iVar5 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,aData,pPager->pageSize,lVar11);
        if (iVar5 != 0) {
          return iVar5;
        }
        iVar5 = write32bits(pPager->jfd,lVar11 + pPager->pageSize,uVar2);
        if (iVar5 != 0) {
          return iVar5;
        }
        pPager->journalOff = (long)pPager->pageSize + pPager->journalOff + 8;
        pPager->nRec = pPager->nRec + 1;
        uVar8 = sqlite3BitvecSet(pPager->pInJournal,pPg->pgno);
        uVar9 = addToSavepointBitvecs(pPager,pPg->pgno);
        if ((uVar9 | uVar8) != 0) {
          return uVar9 | uVar8;
        }
      }
    }
  }
  else {
    iVar5 = 0;
    if ((pPager->nSavepoint == 0) || (iVar6 = subjRequiresPage(pPg), iVar6 == 0)) goto LAB_001229a8;
  }
  iVar5 = 0;
  if ((0 < pPager->nSavepoint) && (iVar6 = subjRequiresPage(pPg), iVar5 = 0, iVar6 != 0)) {
    iVar5 = subjournalPage(pPg);
  }
LAB_001229a8:
  if (pPager->dbSize < pPg->pgno) {
    pPager->dbSize = pPg->pgno;
  }
  return iVar5;
}

Assistant:

static int pager_write(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  int rc = SQLITE_OK;
  int inJournal;

  /* This routine is not called unless a write-transaction has already 
  ** been started. The journal file may or may not be open at this point.
  ** It is never called in the ERROR state.
  */
  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( pPager->errCode==0 );
  assert( pPager->readOnly==0 );

  CHECK_PAGE(pPg);

  /* The journal file needs to be opened. Higher level routines have already
  ** obtained the necessary locks to begin the write-transaction, but the
  ** rollback journal might not yet be open. Open it now if this is the case.
  **
  ** This is done before calling sqlite3PcacheMakeDirty() on the page. 
  ** Otherwise, if it were done after calling sqlite3PcacheMakeDirty(), then
  ** an error might occur and the pager would end up in WRITER_LOCKED state
  ** with pages marked as dirty in the cache.
  */
  if( pPager->eState==PAGER_WRITER_LOCKED ){
    rc = pager_open_journal(pPager);
    if( rc!=SQLITE_OK ) return rc;
  }
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD );
  assert( assert_pager_state(pPager) );

  /* Mark the page as dirty.  If the page has already been written
  ** to the journal then we can return right away.
  */
  sqlite3PcacheMakeDirty(pPg);
  inJournal = pageInJournal(pPager, pPg);
  if( inJournal && (pPager->nSavepoint==0 || !subjRequiresPage(pPg)) ){
    assert( !pagerUseWal(pPager) );
  }else{
  
    /* The transaction journal now exists and we have a RESERVED or an
    ** EXCLUSIVE lock on the main database file.  Write the current page to
    ** the transaction journal if it is not there already.
    */
    if( !inJournal && !pagerUseWal(pPager) ){
      assert( pagerUseWal(pPager)==0 );
      if( pPg->pgno<=pPager->dbOrigSize && isOpen(pPager->jfd) ){
        u32 cksum;
        char *pData2;
        i64 iOff = pPager->journalOff;

        /* We should never write to the journal file the page that
        ** contains the database locks.  The following assert verifies
        ** that we do not. */
        assert( pPg->pgno!=PAGER_MJ_PGNO(pPager) );

        assert( pPager->journalHdr<=pPager->journalOff );
        CODEC2(pPager, pPg->pData, pPg->pgno, 7, return SQLITE_NOMEM, pData2);
        cksum = pager_cksum(pPager, (u8*)pData2);

        /* Even if an IO or diskfull error occurs while journalling the
        ** page in the block above, set the need-sync flag for the page.
        ** Otherwise, when the transaction is rolled back, the logic in
        ** playback_one_page() will think that the page needs to be restored
        ** in the database file. And if an IO error occurs while doing so,
        ** then corruption may follow.
        */
        pPg->flags |= PGHDR_NEED_SYNC;

        rc = write32bits(pPager->jfd, iOff, pPg->pgno);
        if( rc!=SQLITE_OK ) return rc;
        rc = sqlite3OsWrite(pPager->jfd, pData2, pPager->pageSize, iOff+4);
        if( rc!=SQLITE_OK ) return rc;
        rc = write32bits(pPager->jfd, iOff+pPager->pageSize+4, cksum);
        if( rc!=SQLITE_OK ) return rc;

        IOTRACE(("JOUT %p %d %lld %d\n", pPager, pPg->pgno, 
                 pPager->journalOff, pPager->pageSize));
        PAGER_INCR(sqlite3_pager_writej_count);
        PAGERTRACE(("JOURNAL %d page %d needSync=%d hash(%08x)\n",
             PAGERID(pPager), pPg->pgno, 
             ((pPg->flags&PGHDR_NEED_SYNC)?1:0), pager_pagehash(pPg)));

        pPager->journalOff += 8 + pPager->pageSize;
        pPager->nRec++;
        assert( pPager->pInJournal!=0 );
        rc = sqlite3BitvecSet(pPager->pInJournal, pPg->pgno);
        testcase( rc==SQLITE_NOMEM );
        assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
        rc |= addToSavepointBitvecs(pPager, pPg->pgno);
        if( rc!=SQLITE_OK ){
          assert( rc==SQLITE_NOMEM );
          return rc;
        }
      }else{
        if( pPager->eState!=PAGER_WRITER_DBMOD ){
          pPg->flags |= PGHDR_NEED_SYNC;
        }
        PAGERTRACE(("APPEND %d page %d needSync=%d\n",
                PAGERID(pPager), pPg->pgno,
               ((pPg->flags&PGHDR_NEED_SYNC)?1:0)));
      }
    }
  
    /* If the statement journal is open and the page is not in it,
    ** then write the current page to the statement journal.  Note that
    ** the statement journal format differs from the standard journal format
    ** in that it omits the checksums and the header.
    */
    if( pPager->nSavepoint>0 && subjRequiresPage(pPg) ){
      rc = subjournalPage(pPg);
    }
  }

  /* Update the database size and return.
  */
  if( pPager->dbSize<pPg->pgno ){
    pPager->dbSize = pPg->pgno;
  }
  return rc;
}